

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::InternReadFile
          (BlenderImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  IOStream *__p;
  element_type *peVar3;
  StreamReader<false,_false> *this_01;
  element_type *peVar4;
  uchar *puVar5;
  MemoryIOStream *this_02;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  undefined1 *__src;
  undefined1 local_d20 [8];
  Scene scene;
  char *local_888;
  char *local_880;
  char *local_878;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  allocator local_6f1;
  string local_6f0;
  ulong local_6d0;
  size_t have;
  string local_6c0;
  int local_69c;
  undefined1 local_698 [4];
  int ret;
  Bytef block [1024];
  size_type local_290;
  size_t total;
  z_stream zstream;
  shared_ptr<Assimp::IOStream> local_210;
  undefined1 local_200 [8];
  shared_ptr<Assimp::StreamReader<false,_false>_> reader;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  char magic [8];
  string local_190;
  allocator local_169;
  string local_168;
  undefined1 local_148 [8];
  shared_ptr<Assimp::IOStream> stream;
  undefined1 local_128 [8];
  FileDatabase file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  BlenderImporter *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file.next_cache_idx);
  Blender::FileDatabase::FileDatabase((FileDatabase *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"rb",&local_169);
  __p = IOSystem::Open(pIOHandler,pFile,&local_168);
  std::shared_ptr<Assimp::IOStream>::shared_ptr<Assimp::IOStream,void>
            ((shared_ptr<Assimp::IOStream> *)local_148,__p);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_148);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_190,"Could not open file for reading",(allocator *)(magic + 7));
    LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)(magic + 7));
  }
  _local_1a0 = 0;
  peVar3 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_148);
  (*peVar3->_vptr_IOStream[2])(peVar3,&local_1a0,7,1);
  iVar2 = strcmp((char *)&local_1a0,Tokens[0]);
  if (iVar2 != 0) {
    if (((char)local_1a0 != '\x1f') || (local_1a0._1_1_ != -0x75)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c0,
                 "BLENDER magic bytes are missing, couldn\'t find GZIP header either",&local_1c1);
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    }
    LogFunctions<Assimp::BlenderImporter>::LogDebug
              ("Found no BLENDER magic word but a GZIP header, might be a compressed file");
    if (local_1a0._2_1_ != '\b') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e8,"Unsupported GZIP compression method",
                 (allocator *)
                 ((long)&reader.
                         super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&reader.
                         super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
    }
    peVar3 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
    (*peVar3->_vptr_IOStream[4])(peVar3,0);
    this_01 = (StreamReader<false,_false> *)operator_new(0x38);
    zstream.reserved._7_1_ = 1;
    std::shared_ptr<Assimp::IOStream>::shared_ptr
              (&local_210,(shared_ptr<Assimp::IOStream> *)local_148);
    StreamReader<false,_false>::StreamReader(this_01,&local_210,false);
    zstream.reserved._7_1_ = 0;
    std::shared_ptr<Assimp::StreamReader<false,false>>::
    shared_ptr<Assimp::StreamReader<false,false>,void>
              ((shared_ptr<Assimp::StreamReader<false,false>> *)local_200,this_01);
    std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_210);
    zstream.zfree = (free_func)0x0;
    zstream.state = (internal_state *)0x0;
    zstream.zalloc = (alloc_func)0x0;
    zstream.opaque._0_4_ = 0;
    inflateInit2_(&total,0x1f,"1.2.11",0x70);
    peVar4 = std::
             __shared_ptr_access<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_200);
    total = (size_t)StreamReader<false,_false>::GetPtr(peVar4);
    peVar4 = std::
             __shared_ptr_access<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_200);
    zstream.next_in._0_4_ = StreamReader<false,_false>::GetRemainingSize(peVar4);
    local_290 = 0;
    do {
      zstream.next_out._0_4_ = 0x400;
      zstream.total_in = (uLong)local_698;
      local_69c = inflate(&total,0);
      if ((local_69c != 1) && (local_69c != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_6c0,
                   "Failure decompressing this file using gzip, seemingly it is NOT a compressed .BLEND file"
                   ,(allocator *)((long)&have + 7));
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_6c0);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&have + 7));
      }
      local_6d0 = (ulong)(0x400 - (int)zstream.next_out);
      local_290 = local_290 + local_6d0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file.next_cache_idx,
                 local_290);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &file.next_cache_idx);
      __src = local_698;
      memcpy(puVar5 + (local_290 - local_6d0),__src,local_6d0);
    } while (local_69c != 1);
    inflateEnd(&total);
    this_02 = (MemoryIOStream *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x28,(size_t)__src);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &file.next_cache_idx);
    MemoryIOStream::MemoryIOStream(this_02,puVar5,local_290,false);
    std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
              ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)local_148,this_02);
    peVar3 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
    (*peVar3->_vptr_IOStream[2])(peVar3,&local_1a0,7,1);
    iVar2 = strcmp((char *)&local_1a0,"BLENDER");
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_6f0,"Found no BLENDER magic word in decompressed GZIP file",
                 &local_6f1);
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_6f0);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
    }
    std::shared_ptr<Assimp::StreamReader<false,_false>_>::~shared_ptr
              ((shared_ptr<Assimp::StreamReader<false,_false>_> *)local_200);
  }
  peVar3 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_148);
  (*peVar3->_vptr_IOStream[2])(peVar3,&local_1a0,1);
  local_128[0] = (char)local_1a0 == '-';
  peVar3 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_148);
  (*peVar3->_vptr_IOStream[2])(peVar3,&local_1a0,1);
  local_128[1] = (char)local_1a0 == 'v';
  peVar3 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_148);
  (*peVar3->_vptr_IOStream[2])(peVar3,&local_1a0,3,1);
  local_1a0 = (uint)(uint3)local_1a0;
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            (&local_870);
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_870,(char (*) [20])"Blender version is ");
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar6,(char *)&local_1a0);
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar6,(char (*) [2])0xb64073);
  local_878 = (char *)((long)&local_1a0 + 1);
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar6,&local_878);
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar6,(char (*) [10])" (64bit: ");
  local_880 = "false";
  if ((local_128[0] & 1U) != 0) {
    local_880 = "true";
  }
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar6,&local_880);
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar6,(char (*) [18])", little endian: ");
  local_888 = "false";
  if ((local_128[1] & 1U) != 0) {
    local_888 = "true";
  }
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar6,&local_888);
  message = Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar6,(char (*) [2])0xb8eeeb);
  LogFunctions<Assimp::BlenderImporter>::LogInfo(message);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_870);
  this_00 = &scene.base.last.
             super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<Assimp::IOStream>::shared_ptr
            ((shared_ptr<Assimp::IOStream> *)this_00,(shared_ptr<Assimp::IOStream> *)local_148);
  ParseBlendFile(this,(FileDatabase *)local_128,(shared_ptr<Assimp::IOStream> *)this_00);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr
            ((shared_ptr<Assimp::IOStream> *)
             &scene.base.last.
              super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  Blender::Scene::Scene((Scene *)local_d20);
  ExtractScene(this,(Scene *)local_d20,(FileDatabase *)local_128);
  ConvertBlendFile(this,pScene,(Scene *)local_d20,(FileDatabase *)local_128);
  Blender::Scene::~Scene((Scene *)local_d20);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)local_148);
  Blender::FileDatabase::~FileDatabase((FileDatabase *)local_128);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file.next_cache_idx);
  return;
}

Assistant:

void BlenderImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
#ifndef ASSIMP_BUILD_NO_COMPRESSED_BLEND
    std::vector<Bytef> uncompressed;
#endif


    FileDatabase file;
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile,"rb"));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }

    char magic[8] = {0};
    stream->Read(magic,7,1);
    if (strcmp(magic, Tokens[0] )) {
        // Check for presence of the gzip header. If yes, assume it is a
        // compressed blend file and try uncompressing it, else fail. This is to
        // avoid uncompressing random files which our loader might end up with.
#ifdef ASSIMP_BUILD_NO_COMPRESSED_BLEND
        ThrowException("BLENDER magic bytes are missing, is this file compressed (Assimp was built without decompression support)?");
#else

        if (magic[0] != 0x1f || static_cast<uint8_t>(magic[1]) != 0x8b) {
            ThrowException("BLENDER magic bytes are missing, couldn't find GZIP header either");
        }

        LogDebug("Found no BLENDER magic word but a GZIP header, might be a compressed file");
        if (magic[2] != 8) {
            ThrowException("Unsupported GZIP compression method");
        }

        // http://www.gzip.org/zlib/rfc-gzip.html#header-trailer
        stream->Seek(0L,aiOrigin_SET);
        std::shared_ptr<StreamReaderLE> reader = std::shared_ptr<StreamReaderLE>(new StreamReaderLE(stream));

        // build a zlib stream
        z_stream zstream;
        zstream.opaque = Z_NULL;
        zstream.zalloc = Z_NULL;
        zstream.zfree  = Z_NULL;
        zstream.data_type = Z_BINARY;

        // http://hewgill.com/journal/entries/349-how-to-decompress-gzip-stream-with-zlib
        inflateInit2(&zstream, 16+MAX_WBITS);

        zstream.next_in   = reinterpret_cast<Bytef*>( reader->GetPtr() );
        zstream.avail_in  = reader->GetRemainingSize();

        size_t total = 0l;

        // TODO: be smarter about this, decompress directly into heap buffer
        // and decompress the data .... do 1k chunks in the hope that we won't kill the stack
#define MYBLOCK 1024
        Bytef block[MYBLOCK];
        int ret;
        do {
            zstream.avail_out = MYBLOCK;
            zstream.next_out = block;
            ret = inflate(&zstream, Z_NO_FLUSH);

            if (ret != Z_STREAM_END && ret != Z_OK) {
                ThrowException("Failure decompressing this file using gzip, seemingly it is NOT a compressed .BLEND file");
            }
            const size_t have = MYBLOCK - zstream.avail_out;
            total += have;
            uncompressed.resize(total);
            memcpy(uncompressed.data() + total - have,block,have);
        }
        while (ret != Z_STREAM_END);

        // terminate zlib
        inflateEnd(&zstream);

        // replace the input stream with a memory stream
        stream.reset(new MemoryIOStream(reinterpret_cast<uint8_t*>(uncompressed.data()),total));

        // .. and retry
        stream->Read(magic,7,1);
        if (strcmp(magic,"BLENDER")) {
            ThrowException("Found no BLENDER magic word in decompressed GZIP file");
        }
#endif
    }

    file.i64bit = (stream->Read(magic,1,1),magic[0]=='-');
    file.little = (stream->Read(magic,1,1),magic[0]=='v');

    stream->Read(magic,3,1);
    magic[3] = '\0';

    LogInfo((format(),"Blender version is ",magic[0],".",magic+1,
        " (64bit: ",file.i64bit?"true":"false",
        ", little endian: ",file.little?"true":"false",")"
    ));

    ParseBlendFile(file,stream);

    Scene scene;
    ExtractScene(scene,file);

    ConvertBlendFile(pScene,scene,file);
}